

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

IXML_NodeList * ixmlNode_getChildNodes(IXML_Node_conflict *nodeptr)

{
  IXML_Node_conflict *add;
  int iVar1;
  IXML_NodeList *newNodeList;
  IXML_NodeList *local_18;
  
  if (nodeptr == (IXML_Node_conflict *)0x0) {
    return (IXML_NodeList *)0x0;
  }
  local_18 = (IXML_NodeList *)malloc(0x10);
  if (local_18 == (IXML_NodeList *)0x0) {
LAB_001080ad:
    local_18 = (IXML_NodeList *)0x0;
  }
  else {
    ixmlNodeList_init(local_18);
    for (add = nodeptr->firstChild; add != (IXML_Node_conflict *)0x0; add = add->nextSibling) {
      iVar1 = ixmlNodeList_addToNodeList(&local_18,add);
      if (iVar1 != 0) {
        ixmlNodeList_free(local_18);
        goto LAB_001080ad;
      }
    }
  }
  return local_18;
}

Assistant:

IXML_NodeList *ixmlNode_getChildNodes(IXML_Node *nodeptr)
{
	IXML_Node *tempNode;
	IXML_NodeList *newNodeList;
	int rc;

	if (nodeptr == NULL) {
		return NULL;
	}

	newNodeList = (IXML_NodeList *)malloc(sizeof(IXML_NodeList));
	if (newNodeList == NULL) {
		return NULL;
	}

	ixmlNodeList_init(newNodeList);
	tempNode = nodeptr->firstChild;
	while (tempNode != NULL) {
		rc = ixmlNodeList_addToNodeList(&newNodeList, tempNode);
		if (rc != IXML_SUCCESS) {
			ixmlNodeList_free(newNodeList);
			return NULL;
		}

		tempNode = tempNode->nextSibling;
	}

	return newNodeList;
}